

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::setCapacity
          (Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this,
          size_t newSize)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *pRVar2;
  Entry *pEVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> newBuilder;
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x20,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pEVar3 = (this->builder).ptr; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    (local_38.pos)->key = pEVar3->key;
    ((local_38.pos)->value).content.ptr = (pEVar3->value).content.ptr;
    ((local_38.pos)->value).content.size_ = (pEVar3->value).content.size_;
    ((local_38.pos)->value).content.disposer = (pEVar3->value).content.disposer;
    local_38.pos = local_38.pos + 1;
    (pEVar3->value).content.ptr = (char *)0x0;
    (pEVar3->value).content.size_ = 0;
  }
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::operator=
            (&this->builder,&local_38);
  pEVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar3 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)0x0
    ;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar3,0x20,(long)pRVar2 - (long)pEVar3 >> 5,
               (long)pEVar1 - (long)pEVar3 >> 5,
               ArrayDisposer::
               Dispose_<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }